

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void gc_finalize(lua_State *L)

{
  cTValue *local_e0;
  cTValue *local_d8;
  TValue *tv;
  TValue tmp;
  cTValue *mo;
  GCobj *o;
  global_State *g;
  lua_State *L_local;
  TValue **local_98;
  global_State *local_90;
  cTValue *local_88;
  TValue **local_80;
  lua_State *local_78;
  undefined4 local_6c;
  cTValue *local_68;
  TValue **local_60;
  lua_State *local_58;
  undefined4 local_4c;
  cTValue *local_48;
  TValue **local_40;
  char *local_38;
  TValue **local_30;
  lua_State *local_28;
  char *local_20;
  TValue **local_18;
  global_State *local_10;
  
  o = (GCobj *)(L->glref).ptr64;
  mo = *(o->th).cframe;
  if (mo == (cTValue *)(o->th).cframe) {
    (o->th).cframe = (void *)0x0;
  }
  else {
    *(cTValue *)(o->th).cframe = *mo;
  }
  g = (global_State *)L;
  if (*(char *)((long)mo + 9) == '\n') {
    *mo = (cTValue)(o->th).top;
    (o->th).top = mo;
    *(byte *)(mo + 1) = *(byte *)(mo + 1) & 0xf8 | (byte)(o->gch).metatable.gcptr64 & 3;
    *(byte *)(mo + 1) = *(byte *)(mo + 1) & 0xef;
    local_80 = &tv;
    local_6c = 0xfffffff5;
    local_4c = 0xfffffff5;
    tv = (TValue *)((ulong)mo | 0xfffa800000000000);
    local_38 = "store to dead GC object";
    local_88 = mo;
    local_78 = L;
    local_68 = mo;
    local_60 = local_80;
    local_58 = L;
    local_48 = mo;
    local_40 = local_80;
    local_30 = local_80;
    local_28 = L;
    L_local = (lua_State *)
              lj_tab_set(L,*(GCtab **)(*(long *)((long)o + 0x180) + 0x20),(cTValue *)&tv);
    if (*(uint64_t *)L_local != 0xffffffffffffffff) {
      *(undefined1 *)((long)&(o->gch).metatable.gcptr64 + 2) = 0;
      local_90 = g;
      local_98 = &tv;
      tv = *(TValue **)L_local;
      local_10 = g;
      local_20 = "copy of dead GC object";
      *(uint64_t *)L_local = 0xffffffffffffffff;
      local_18 = local_98;
      gc_call_finalizer((global_State *)&o->gch,(lua_State *)g,(cTValue *)&tv,(GCobj *)mo);
    }
  }
  else {
    *mo = **(cTValue **)((long)o + 0xc0);
    **(ulong **)((long)o + 0xc0) = (ulong)mo;
    *(byte *)(mo + 1) = *(byte *)(mo + 1) & 0xf8 | (byte)(o->gch).metatable.gcptr64 & 3;
    if (mo[4].u64 == 0) {
      local_d8 = (cTValue *)0x0;
    }
    else {
      if ((*(byte *)(mo[4].u64 + 10) & 4) == 0) {
        local_e0 = lj_meta_cache((GCtab *)mo[4],MM_gc,*(GCstr **)((long)o + 0x1b8));
      }
      else {
        local_e0 = (cTValue *)0x0;
      }
      local_d8 = local_e0;
    }
    tmp.u64 = (uint64_t)local_d8;
    if (local_d8 != (cTValue *)0x0) {
      gc_call_finalizer((global_State *)&o->gch,(lua_State *)g,local_d8,(GCobj *)mo);
    }
  }
  return;
}

Assistant:

static void gc_finalize(lua_State *L)
{
  global_State *g = G(L);
  GCobj *o = gcnext(gcref(g->gc.mmudata));
  cTValue *mo;
  lj_assertG(tvref(g->jit_base) == NULL, "finalizer called on trace");
  /* Unchain from list of userdata to be finalized. */
  if (o == gcref(g->gc.mmudata))
    setgcrefnull(g->gc.mmudata);
  else
    setgcrefr(gcref(g->gc.mmudata)->gch.nextgc, o->gch.nextgc);
#if LJ_HASFFI
  if (o->gch.gct == ~LJ_TCDATA) {
    TValue tmp, *tv;
    /* Add cdata back to the GC list and make it white. */
    setgcrefr(o->gch.nextgc, g->gc.root);
    setgcref(g->gc.root, o);
    makewhite(g, o);
    o->gch.marked &= (uint8_t)~LJ_GC_CDATA_FIN;
    /* Resolve finalizer. */
    setcdataV(L, &tmp, gco2cd(o));
    tv = lj_tab_set(L, ctype_ctsG(g)->finalizer, &tmp);
    if (!tvisnil(tv)) {
      g->gc.nocdatafin = 0;
      copyTV(L, &tmp, tv);
      setnilV(tv);  /* Clear entry in finalizer table. */
      gc_call_finalizer(g, L, &tmp, o);
    }
    return;
  }
#endif
  /* Add userdata back to the main userdata list and make it white. */
  setgcrefr(o->gch.nextgc, mainthread(g)->nextgc);
  setgcref(mainthread(g)->nextgc, o);
  makewhite(g, o);
  /* Resolve the __gc metamethod. */
  mo = lj_meta_fastg(g, tabref(gco2ud(o)->metatable), MM_gc);
  if (mo)
    gc_call_finalizer(g, L, mo, o);
}